

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::printGridInfo(Amr *this,ostream *os,int min_lev,int max_lev)

{
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> this_00;
  long lVar1;
  ulong uVar2;
  Long LVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int i;
  long lVar8;
  double dVar9;
  Box local_4c;
  
  for (lVar5 = (long)min_lev; lVar5 <= max_lev; lVar5 = lVar5 + 1) {
    this_00.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (this->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    lVar1 = (long)(((shared_ptr<amrex::BARef> *)
                   ((long)this_00.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x120))->
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar2 = (*(long *)(lVar1 + 8) - *(long *)lVar1) / 0x1c;
    LVar3 = AmrLevel::countCells
                      ((AmrLevel *)
                       this_00.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
    dVar9 = Box::d_numPts(&(this->super_AmrCore).super_AmrMesh.geom.
                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar5].domain);
    lVar1 = *(long *)(*(long *)((long)(this->amr_level).
                                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      .
                                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + 0x170) + 200);
    poVar4 = std::operator<<(os,"  Level ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar5);
    poVar4 = std::operator<<(poVar4,"   ");
    iVar7 = (int)uVar2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
    poVar4 = std::operator<<(poVar4," grids  ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4," cells  ");
    poVar4 = std::ostream::_M_insert<double>(((double)LVar3 * 100.0) / dVar9);
    poVar4 = std::operator<<(poVar4," % of domain");
    std::operator<<(poVar4,'\n');
    uVar2 = uVar2 & 0xffffffff;
    if (iVar7 < 1) {
      uVar2 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      BoxArray::operator[]
                (&local_4c,
                 (BoxArray *)
                 ((long)this_00.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8),
                 (int)uVar6);
      poVar4 = std::operator<<(os,' ');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar5);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = amrex::operator<<(poVar4,&local_4c);
      std::operator<<(poVar4,"   ");
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (os,(local_4c.bigend.vect[lVar8] - local_4c.smallend.vect[lVar8]) + 1);
        std::operator<<(poVar4,' ');
      }
      poVar4 = std::operator<<(os,":: ");
      poVar4 = (ostream *)
               std::ostream::operator<<(poVar4,*(int *)(**(long **)(lVar1 + 0x70) + uVar6 * 4));
      std::operator<<(poVar4,'\n');
    }
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void
Amr::printGridInfo (std::ostream& os,
                    int           min_lev,
                    int           max_lev)
{
    for (int lev = min_lev; lev <= max_lev; lev++)
    {
        const BoxArray&           bs      = amr_level[lev]->boxArray();
        int                       numgrid = bs.size();
        Long                      ncells  = amr_level[lev]->countCells();
        double                    ntot    = Geom(lev).Domain().d_numPts();
        Real                      frac    = Real(100.0 * double(ncells) / ntot);
        const DistributionMapping& map    = amr_level[lev]->get_new_data(0).DistributionMap();

        os << "  Level "
           << lev
           << "   "
           << numgrid
           << " grids  "
           << ncells
           << " cells  "
           << frac
           << " % of domain"
           << '\n';


        for (int k = 0; k < numgrid; k++)
        {
            const Box& b = bs[k];

            os << ' ' << lev << ": " << b << "   ";

            for (int i = 0; i < AMREX_SPACEDIM; i++)
                os << b.length(i) << ' ';

            os << ":: " << map[k] << '\n';
        }
    }

    os << std::endl; // Make sure we flush!
}